

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void wallet::wallet_tests::TestCoinsResult
               (ListCoinsTest *context,OutputType out_type,CAmount amount,
               map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
               *expected_coins_sizes)

{
  long lVar1;
  optional<CFeeRate> feerate;
  bool bVar2;
  pointer pCVar3;
  size_type sVar4;
  const_string *this;
  long in_FS_OFFSET;
  type *size;
  type *type;
  map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
  *__range2;
  uint32_t i;
  CWalletTx *wtx;
  iterator __end2;
  iterator __begin2;
  CoinFilterParams filter;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock59;
  CoinsResult available_coins;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  dest;
  CWalletTx *in_stack_fffffffffffffc88;
  lazy_ostream *in_stack_fffffffffffffc90;
  char *in_stack_fffffffffffffc98;
  CWallet *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  const_string *in_stack_fffffffffffffcb0;
  mapped_type *in_stack_fffffffffffffcb8;
  lazy_ostream *in_stack_fffffffffffffcc0;
  allocator<char> *in_stack_fffffffffffffcc8;
  unit_test_log_t *this_00;
  char *in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  string *in_stack_fffffffffffffd08;
  CWallet *in_stack_fffffffffffffd10;
  OutputType type_00;
  uint local_2a0;
  lazy_ostream local_260;
  undefined1 local_248 [64];
  _Base_ptr local_208;
  _Base_ptr local_200;
  allocator<char> local_1f1;
  optional<CFeeRate> local_1f0 [3];
  undefined1 local_1be;
  CoinFilterParams *in_stack_fffffffffffffe70;
  CCoinControl *in_stack_fffffffffffffe78;
  CWallet *in_stack_fffffffffffffe80;
  CRecipient *in_stack_fffffffffffffea8;
  ListCoinsTestingSetup *in_stack_fffffffffffffeb0;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff21 [15];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffffc88);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffc88);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffcc8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffcc0,
             (char *)in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffcac,SUB41((uint)in_stack_fffffffffffffca8 >> 0x18,0));
  pCVar3 = std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
                     ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
                      in_stack_fffffffffffffc88);
  type_00 = (OutputType)((ulong)pCVar3 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  CWallet::GetNewDestination(in_stack_fffffffffffffd10,type_00,in_stack_fffffffffffffd08);
  inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0,
             (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),(char *)in_stack_fffffffffffffcb0,
             (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
            *)in_stack_fffffffffffffc88,
           (Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
            *)0xe33d93);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
             *)in_stack_fffffffffffffc88);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc88);
  std::allocator<char>::~allocator(&local_1f1);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::operator*((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
               *)in_stack_fffffffffffffc88);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)in_stack_fffffffffffffc88,
            (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)0xe33e00);
  uVar5 = 1;
  ListCoinsTestingSetup::AddTx(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  CRecipient::~CRecipient((CRecipient *)in_stack_fffffffffffffc88);
  CoinFilterParams::CoinFilterParams((CoinFilterParams *)in_stack_fffffffffffffc88);
  local_1be = 0;
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffffc98);
  std::optional<CFeeRate>::optional(local_1f0);
  feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._1_15_ = in_stack_ffffffffffffff21;
  feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_payload._M_value.nSatoshisPerK._0_1_ = uVar5;
  AvailableCoins(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,feerate,
                 in_stack_fffffffffffffe70);
  local_2a0 = 0;
  while( true ) {
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffc88);
    sVar4 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffc88);
    if (sVar4 <= local_2a0) break;
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
               in_stack_fffffffffffffc88);
    CWalletTx::GetHash(in_stack_fffffffffffffc88);
    COutPoint::COutPoint
              ((COutPoint *)in_stack_fffffffffffffc98,(Txid *)in_stack_fffffffffffffc90,
               (uint32_t)((ulong)in_stack_fffffffffffffc88 >> 0x20));
    CWallet::LockCoin(in_stack_fffffffffffffca0,(COutPoint *)in_stack_fffffffffffffc98,
                      (WalletBatch *)in_stack_fffffffffffffc90);
    local_2a0 = local_2a0 + 1;
  }
  local_200 = (_Base_ptr)
              std::
              map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
              ::begin((map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
                       *)in_stack_fffffffffffffc90);
  local_208 = (_Base_ptr)
              std::
              map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
              ::end((map<OutputType,_unsigned_long,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_unsigned_long>_>_>
                     *)in_stack_fffffffffffffc90);
  while( true ) {
    bVar2 = std::operator==((_Self *)in_stack_fffffffffffffc98,(_Self *)in_stack_fffffffffffffc90);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::_Rb_tree_iterator<std::pair<const_OutputType,_unsigned_long>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_OutputType,_unsigned_long>_> *)
               in_stack_fffffffffffffc88);
    std::get<0ul,OutputType_const,unsigned_long>
              ((pair<const_OutputType,_unsigned_long> *)in_stack_fffffffffffffc88);
    this = (const_string *)
           std::get<1ul,OutputType_const,unsigned_long>
                     ((pair<const_OutputType,_unsigned_long> *)in_stack_fffffffffffffc88);
    do {
      this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
                 (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc88);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (this_00,(const_string *)in_stack_fffffffffffffcc0,(size_t)in_stack_fffffffffffffcb8
                 ,in_stack_fffffffffffffcb0);
      in_stack_fffffffffffffcc0 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_fffffffffffffc90,(char (*) [1])in_stack_fffffffffffffc88);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
                 (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
      in_stack_fffffffffffffcb0 = this;
      in_stack_fffffffffffffcb8 =
           std::
           map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
           ::operator[]((map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                         *)this,(key_type *)
                                CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      local_260._vptr_lazy_ostream =
           (_func_int **)
           std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::size
                     ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)
                      in_stack_fffffffffffffc88);
      in_stack_fffffffffffffc98 = "available_coins.coins[type].size()";
      in_stack_fffffffffffffc90 = &local_260;
      in_stack_fffffffffffffc88 = (CWalletTx *)0x1ce354b;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
                (local_248,&local_260.m_empty,0x2b2,1,2,in_stack_fffffffffffffcb0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffc88);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
      in_stack_fffffffffffffcac = CONCAT13(bVar2,(int3)in_stack_fffffffffffffcac);
    } while (bVar2);
    std::_Rb_tree_iterator<std::pair<const_OutputType,_unsigned_long>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_OutputType,_unsigned_long>_> *)
               in_stack_fffffffffffffc88);
  }
  CoinsResult::~CoinsResult((CoinsResult *)in_stack_fffffffffffffc88);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
             *)in_stack_fffffffffffffc88);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffc88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestCoinsResult(ListCoinsTest& context, OutputType out_type, CAmount amount,
                     std::map<OutputType, size_t>& expected_coins_sizes)
{
    LOCK(context.wallet->cs_wallet);
    util::Result<CTxDestination> dest = Assert(context.wallet->GetNewDestination(out_type, ""));
    CWalletTx& wtx = context.AddTx(CRecipient{*dest, amount, /*fSubtractFeeFromAmount=*/true});
    CoinFilterParams filter;
    filter.skip_locked = false;
    CoinsResult available_coins = AvailableCoins(*context.wallet, nullptr, std::nullopt, filter);
    // Lock outputs so they are not spent in follow-up transactions
    for (uint32_t i = 0; i < wtx.tx->vout.size(); i++) context.wallet->LockCoin({wtx.GetHash(), i});
    for (const auto& [type, size] : expected_coins_sizes) BOOST_CHECK_EQUAL(size, available_coins.coins[type].size());
}